

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

BasicMutSuffix<double> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::FindSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<double> *sufdef)

{
  SuffixBase s;
  SafeBool SVar1;
  SuffixDef<double> *in_RSI;
  SuffixManager *in_RDI;
  MutSuffix suf_raw;
  Kind main_kind;
  BasicSuffixSet<std::allocator<char>_> *in_stack_00000058;
  undefined1 in_stack_00000060 [16];
  Kind in_stack_ffffffffffffffac;
  SuffixBase local_28;
  uint local_1c;
  SuffixDef<double> *local_18;
  BasicSuffix<double> local_8;
  
  local_18 = in_RSI;
  local_1c = SuffixDef<double>::kind(in_RSI);
  local_1c = local_1c & 3;
  s.impl_ = (Impl *)SuffixManager::suffixes(in_RDI,in_stack_ffffffffffffffac);
  SuffixDef<double>::name(local_18);
  local_28.impl_ =
       (Impl *)BasicSuffixSet<std::allocator<char>_>::Find
                         (in_stack_00000058,(StringRef)in_stack_00000060);
  SVar1 = internal::SuffixBase::operator_cast_to_function_pointer(&local_28);
  if (SVar1 == 0) {
    BasicMutSuffix<double>::BasicMutSuffix((BasicMutSuffix<double> *)0x39aa52);
  }
  else {
    local_8.super_SuffixBase.impl_ =
         (SuffixBase)Cast<mp::BasicMutSuffix<double>>((MutSuffix)s.impl_);
  }
  return (BasicMutSuffix<double>)local_8.super_SuffixBase.impl_.impl_;
}

Assistant:

BasicMutSuffix<T> FindSuffix(const SuffixDef<T>& sufdef) {
    auto main_kind = (suf::Kind)(sufdef.kind() & suf::KIND_MASK);
    auto suf_raw = suffixes(main_kind).Find(sufdef.name());
    if (suf_raw)
      return Cast< BasicMutSuffix<T> >( suf_raw );
    return BasicMutSuffix<T>();
  }